

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# samplerate.c
# Opt level: O3

int src_reset(SRC_STATE *state)

{
  if (state != (SRC_STATE *)0x0) {
    (*state->vt->reset)(state);
    state->last_ratio = 0.0;
    state->last_position = 0.0;
    state->error = SRC_ERR_NO_ERROR;
    state->saved_frames = 0;
    state->saved_data = (float *)0x0;
    return 0;
  }
  return 2;
}

Assistant:

int
src_reset (SRC_STATE *state)
{
	if (state == NULL)
		return SRC_ERR_BAD_STATE ;

	state->vt->reset (state) ;

	state->last_position = 0.0 ;
	state->last_ratio = 0.0 ;

	state->saved_data = NULL ;
	state->saved_frames = 0 ;

	state->error = SRC_ERR_NO_ERROR ;

	return SRC_ERR_NO_ERROR ;
}